

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O0

int Dau_DsdCheckDecExist_rec(char *pStr,char **p,int *pMatches,int *pnSupp)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  char *q_1;
  uint Mask_1;
  int uSupp;
  int Sum;
  int i;
  char *q;
  int nMints;
  int nParts;
  int pSupps [8];
  int m;
  uint Mask;
  int *pnSupp_local;
  int *pMatches_local;
  char **p_local;
  char *pStr_local;
  
  if (**p == '!') {
    *p = *p + 1;
  }
  while( true ) {
    if (((**p < 'A') || (bVar1 = true, 'F' < **p)) && (bVar1 = false, '/' < **p)) {
      bVar1 = **p < ':';
    }
    if (!bVar1) break;
    *p = *p + 1;
  }
  if ((**p < 'a') || ('z' < **p)) {
    if ((**p == '(') || (**p == '[')) {
      pSupps[7] = 0;
      memset(&nMints,0,0x20);
      q._4_4_ = 0;
      _Sum = pStr + pMatches[(long)*p - (long)pStr];
      if ((int)*_Sum != **p + 1 + (uint)(**p != '(')) {
        __assert_fail("*q == **p + 1 + (**p != \'(\')",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0x40,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
      }
      *p = *p + 1;
      while (*p < _Sum) {
        uVar2 = Dau_DsdCheckDecExist_rec(pStr,p,pMatches,&nMints + q._4_4_);
        pSupps[7] = uVar2 | pSupps[7];
        *pnSupp = (&nMints)[q._4_4_] + *pnSupp;
        *p = *p + 1;
        q._4_4_ = q._4_4_ + 1;
      }
      if (*p != _Sum) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0x46,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
      }
      if (q._4_4_ < 2) {
        __assert_fail("nParts > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0x47,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
      }
      q._0_4_ = 1 << ((byte)q._4_4_ & 0x1f);
      for (pSupps[6] = 1; pSupps[6] < (int)q; pSupps[6] = pSupps[6] + 1) {
        Mask_1 = 0;
        for (uSupp = 0; uSupp < q._4_4_; uSupp = uSupp + 1) {
          if ((pSupps[6] >> ((byte)uSupp & 0x1f) & 1U) != 0) {
            Mask_1 = (&nMints)[uSupp] + Mask_1;
          }
        }
        if (((int)Mask_1 < 1) || (8 < (int)Mask_1)) {
          __assert_fail("Sum > 0 && Sum <= 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                        ,0x4f,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
        }
        if (1 < (int)Mask_1) {
          pSupps[7] = 1 << ((byte)Mask_1 & 0x1f) | pSupps[7];
        }
      }
      pStr_local._4_4_ = pSupps[7];
    }
    else {
      if ((**p != '<') && (**p != '{')) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0x65,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
      }
      q_1._0_4_ = 0;
      pcVar3 = pStr + pMatches[(long)*p - (long)pStr];
      if ((int)*pcVar3 != **p + 1 + (uint)(**p != '(')) {
        __assert_fail("*q == **p + 1 + (**p != \'(\')",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0x5a,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
      }
      *p = *p + 1;
      while (*p < pcVar3) {
        q_1._4_4_ = 0;
        uVar2 = Dau_DsdCheckDecExist_rec(pStr,p,pMatches,(int *)((long)&q_1 + 4));
        q_1._0_4_ = uVar2 | (uint)q_1;
        *pnSupp = q_1._4_4_ + *pnSupp;
        *p = *p + 1;
      }
      if (*p != pcVar3) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0x61,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
      }
      pStr_local._4_4_ = 1 << ((byte)*pnSupp & 0x1f) | (uint)q_1;
    }
  }
  else {
    *pnSupp = *pnSupp + 1;
    pStr_local._4_4_ = 0;
  }
  return pStr_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Finds all boundsets for which decomposition exists.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Dau_DsdCheckDecExist_rec( char * pStr, char ** p, int * pMatches, int * pnSupp )
{
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        (*pnSupp)++;
        return 0;
    }
    if ( **p == '(' || **p == '[' ) // and/xor
    {
        unsigned Mask = 0;
        int m, pSupps[8] = {0}, nParts = 0, nMints;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Mask |= Dau_DsdCheckDecExist_rec( pStr, p, pMatches, &pSupps[nParts] );
            *pnSupp += pSupps[nParts++];
        }
        assert( *p == q );
        assert( nParts > 1 );
        nMints = (1 << nParts);
        for ( m = 1; m < nMints; m++ )
        {
            int i, Sum = 0;
            for ( i = 0; i < nParts; i++ )
                if ( (m >> i) & 1 )
                    Sum += pSupps[i];
            assert( Sum > 0 && Sum <= 8 );
            if ( Sum >= 2 )
                Mask |= (1 << Sum);
        }
        return Mask;
    }
    if ( **p == '<' || **p == '{' ) // mux
    {
        int uSupp;
        unsigned Mask = 0;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            uSupp = 0;
            Mask |= Dau_DsdCheckDecExist_rec( pStr, p, pMatches, &uSupp );
            *pnSupp += uSupp;
        }
        assert( *p == q );
        Mask |= (1 << *pnSupp);
        return Mask;
    }
    assert( 0 );
    return 0;
}